

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void __thiscall
matchit::impl::IdBlockBase<mathiu::impl::Difference>::reset
          (IdBlockBase<mathiu::impl::Difference> *this,int32_t depth)

{
  _Variadic_union<std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
  local_48;
  undefined8 local_28;
  
  if (depth <= this->mDepth) {
    local_48._16_8_ = 0;
    local_48._24_8_ = 0;
    local_48._M_rest._M_rest =
         (_Variadic_union<mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>)0x0;
    local_48._8_8_ = 0;
    local_28 = 0;
    std::__detail::__variant::
    _Move_assign_base<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
    ::operator=((_Move_assign_base<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
                 *)&this->mVariant,
                (_Move_assign_base<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
                 *)&local_48);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Difference,_mathiu::impl::Difference_*,_const_mathiu::impl::Difference_*>
                         *)&local_48);
    this->mDepth = depth;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth)
            {
                if (mDepth - depth >= 0)
                {
                    mVariant = {};
                    mDepth = depth;
                }
            }